

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf-test.cpp
# Opt level: O1

void u8_to_u_test(int line,UTF_S8 *str1,UTF_US16 *str2,bool ok)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  char16_t *pcVar4;
  char16_t cVar5;
  byte *pbVar6;
  byte *pbVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  UTF_UC8 uc8 [4];
  UTF_US16 tmp;
  UTF_UC16 buf [256];
  byte local_25c [4];
  UTF_US16 local_258;
  char16_t local_238 [260];
  
  local_258._M_string_length = 0;
  local_258.field_2._M_local_buf[0] = L'\0';
  local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  bVar2 = UTF_u8_to_u<(char)63>((UTF_US8 *)str1,&local_258);
  UTF_test(line,bVar2 == ok);
  iVar3 = std::__cxx11::
          basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::compare
                    (&local_258,str2);
  UTF_test(line,iVar3 == 0);
  if (str1->_M_string_length == 0) {
    pcVar4 = local_238;
  }
  else {
    pbVar7 = (byte *)(str1->_M_dataplus)._M_p;
    pbVar6 = pbVar7 + str1->_M_string_length;
    pcVar4 = local_238;
    lVar9 = 0;
    while( true ) {
      bVar1 = *pbVar7;
      uVar8 = 1;
      if ((((char)bVar1 < '\0') && (uVar8 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
         (uVar8 = 3, (bVar1 & 0xf0) != 0xe0)) {
        uVar8 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
      }
      if (uVar8 == 1) goto LAB_001014b7;
      if (uVar8 != 0) break;
      if (lVar9 == 0x1fe) goto LAB_001016e7;
      *pcVar4 = L'?';
      pbVar7 = pbVar7 + 1;
      pcVar4 = (char16_t *)((long)local_238 + lVar9 + 2);
      lVar9 = lVar9 + 2;
      if (pbVar7 == pbVar6) goto LAB_001016cf;
    }
    uVar10 = 1;
    while (pbVar7 = pbVar7 + 1, pbVar7 != pbVar6) {
      local_25c[uVar10] = *pbVar7;
      uVar10 = uVar10 + 1;
      if (uVar8 == uVar10) {
LAB_001014b7:
        uVar8 = 1;
        if ((((char)bVar1 < '\0') && (uVar8 = 2, 0x1d < (byte)(bVar1 + 0x3e))) &&
           (uVar8 = 3, (bVar1 & 0xf0) != 0xe0)) {
          uVar8 = (uint)((bVar1 & 0xf8) == 0xf0) << 2;
        }
        (*(code *)(&DAT_00106004 + *(int *)(&DAT_00106004 + (ulong)uVar8 * 4)))
                  (0,&DAT_00106004 + *(int *)(&DAT_00106004 + (ulong)uVar8 * 4),pbVar7);
        return;
      }
    }
    local_25c[0] = bVar1;
    if (lVar9 == 0x1fe) {
LAB_001016e7:
      bVar2 = false;
      goto LAB_001016e9;
    }
    *pcVar4 = L'?';
    pcVar4 = pcVar4 + 1;
  }
LAB_001016cf:
  bVar2 = true;
LAB_001016e9:
  *pcVar4 = L'\0';
  UTF_test(line,bVar2);
  cVar5 = *local_258._M_dataplus._M_p;
  if (cVar5 == L'\0') {
    pcVar4 = local_238;
  }
  else {
    pcVar4 = local_238;
    lVar9 = 0;
    while (*pcVar4 != L'\0') {
      bVar2 = local_258._M_string_length + 1 == lVar9;
      if ((cVar5 != *pcVar4) || (local_258._M_string_length + 1 == lVar9)) goto LAB_0010174f;
      pcVar4 = pcVar4 + 1;
      cVar5 = local_258._M_dataplus._M_p[lVar9 + 1];
      lVar9 = lVar9 + 1;
      if (cVar5 == L'\0') break;
    }
  }
  bVar2 = cVar5 == *pcVar4;
LAB_0010174f:
  UTF_test(line,bVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p);
  }
  return;
}

Assistant:

void u8_to_u_test(int line, const UTF_S8& str1, const UTF_US16& str2, bool ok)
{
    UTF_US16 tmp;
    UTF_UC16 buf[256];
    UTF_test(line, UTF_u8_to_u<'?'>(str1, tmp) == ok);
    UTF_test(line, tmp == str2);
    UTF_test(line, UTF_j8_to_uj16(str1.c_str(), str1.size(), buf, 256) == UTF_SUCCESS);
    UTF_test(line, UTF_uj16_cmpn(tmp.c_str(), buf, UTF_SIZE_T(tmp.size() + 1)) == 0);
}